

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O3

void FAudio_INTERNAL_GenerateOutput(FAudio *audio,float *output)

{
  uint32_t *puVar1;
  uint64_t *puVar2;
  float fVar3;
  ushort uVar4;
  FAudioFilterType FVar5;
  code *pcVar6;
  FAudioSourceVoice *voice;
  FAudioVoiceCallback *pFVar7;
  FAudioBufferEntry *pFVar8;
  OnBufferEndFunc p_Var9;
  OnStreamEndFunc p_Var10;
  OnBufferStartFunc p_Var11;
  FAudioFilterState *pafVar12;
  FAudioVoice *pFVar13;
  uint uVar14;
  uint uVar15;
  FAudioWaveFormatEx *pFVar16;
  float *pfVar17;
  FAudioSendDescriptor *pFVar18;
  FAudioSendDescriptor *pFVar19;
  ulong uVar20;
  float **ppfVar21;
  FAudioMasteringVoice *pFVar22;
  float *pfVar23;
  ulong uVar24;
  FAudioBufferEntry *pFVar25;
  FAudioFilterParameters *pFVar26;
  uint64_t uVar27;
  int iVar28;
  FAudioVoice **ppFVar29;
  uint uVar30;
  FAudioSendDescriptor *pFVar31;
  FAudio *pFVar32;
  LinkedList *pLVar33;
  FAudioVoice *pFVar34;
  uint32_t uVar35;
  uint32_t uVar36;
  long lVar37;
  uint uVar38;
  bool bVar39;
  float fVar40;
  float fVar41;
  uint32_t totalSamples;
  uint64_t local_68;
  FAudio *local_60;
  FAudioSendDescriptor *local_58;
  LinkedList *local_50;
  uint local_44;
  ulong local_40;
  float *local_38;
  
  if (audio->active != '\0') {
    FAudio_OPERATIONSET_Execute(audio);
    FAudio_PlatformLockMutex(audio->callbackLock);
    for (pLVar33 = audio->callbacks; pLVar33 != (LinkedList *)0x0; pLVar33 = pLVar33->next) {
      pcVar6 = *(code **)((long)pLVar33->entry + 0x10);
      if (pcVar6 != (code *)0x0) {
        (*pcVar6)();
      }
    }
    FAudio_PlatformUnlockMutex(audio->callbackLock);
    pFVar22 = audio->master;
    pfVar17 = (pFVar22->field_19).mix.inputCache;
    local_38 = output;
    if (pfVar17 == (float *)0x0) {
      (pFVar22->field_19).master.output = output;
    }
    else {
      (pFVar22->field_19).master.output = pfVar17;
      SDL_memset((audio->master->field_19).mix.inputCache,0,
                 (ulong)(audio->master->field_19).master.inputChannels * (ulong)audio->updateSize *
                 4);
    }
    FAudio_PlatformLockMutex(audio->sourceLock);
    local_60 = audio;
    for (pLVar33 = audio->sources; pLVar33 != (LinkedList *)0x0; pLVar33 = pLVar33->next) {
      voice = (FAudioSourceVoice *)pLVar33->entry;
      audio->processingSource = voice;
      FAudio_INTERNAL_FlushPendingBuffers(voice);
      pFVar34 = audio->processingSource;
      if ((pFVar34->field_19).src.active != '\0') {
        FAudio_PlatformLockMutex(pFVar34->sendLock);
        fVar3 = (pFVar34->field_19).src.resampleFreq;
        pFVar16 = (pFVar34->field_19).src.format;
        fVar40 = (pFVar34->field_19).src.freqRatio;
        fVar41 = (float)pFVar16->nSamplesPerSec * fVar40;
        if ((fVar3 != fVar41) || (NAN(fVar3) || NAN(fVar41))) {
          if ((pFVar34->sends).SendCount == 0) {
            ppFVar29 = &pFVar34->audio->master;
          }
          else {
            ppFVar29 = &((pFVar34->sends).pSends)->pOutputVoice;
          }
          fVar3 = (((float)pFVar16->nSamplesPerSec * fVar40) /
                  (float)*(uint *)((long)&(*ppFVar29)->field_19 +
                                  (ulong)((*ppFVar29)->type != FAUDIO_VOICE_MASTER) * 0x10 + 0x14))
                  * 4.2949673e+09 + 0.5;
          uVar24 = (ulong)fVar3;
          (pFVar34->field_19).src.resampleStep =
               (long)(fVar3 - 9.223372e+18) & (long)uVar24 >> 0x3f | uVar24;
          (pFVar34->field_19).src.resampleFreq = (float)pFVar16->nSamplesPerSec * fVar40;
        }
        if ((pFVar34->field_19).src.active == '\x02') {
          pFVar32 = pFVar34->audio;
          uVar15 = (pFVar34->field_19).src.resampleSamples;
LAB_001196e6:
          uVar14 = pFVar16->nChannels * uVar15;
          if (pFVar32->resampleSamples < uVar14) {
            pFVar32->resampleSamples = uVar14;
            pfVar17 = (float *)(*pFVar32->pRealloc)(pFVar32->resampleCache,(ulong)uVar14 << 2);
            pFVar32->resampleCache = pfVar17;
            uVar15 = (pFVar34->field_19).src.resampleSamples;
            pFVar32 = pFVar34->audio;
            uVar14 = ((pFVar34->field_19).src.format)->nChannels * uVar15;
          }
          uVar24 = (ulong)uVar15;
          local_68 = CONCAT44(local_68._4_4_,uVar15);
          SDL_memset(pFVar32->resampleCache,0,(ulong)uVar14 << 2);
          pfVar17 = pFVar34->audio->resampleCache;
LAB_00119e42:
          uVar15 = (uint)uVar24;
          if ((pFVar34->flags & 8) != 0) {
            FAudio_PlatformLockMutex(pFVar34->filterLock);
            if (uVar15 != 0) {
              pafVar12 = pFVar34->filterState;
              uVar4 = ((pFVar34->field_19).src.format)->nChannels;
              uVar24 = 0;
              uVar14 = 0;
              do {
                iVar28 = (int)uVar24;
                if (uVar4 != 0) {
                  FVar5 = (pFVar34->filter).Type;
                  lVar37 = 0;
                  do {
                    fVar3 = *(float *)((long)*pafVar12 + lVar37 + 4);
                    fVar40 = (pFVar34->filter).Frequency * fVar3 +
                             *(float *)((long)*pafVar12 + lVar37);
                    *(float *)((long)*pafVar12 + lVar37) = fVar40;
                    fVar41 = (pfVar17[uVar24] - fVar40) - (pFVar34->filter).OneOverQ * fVar3;
                    *(float *)((long)*pafVar12 + lVar37 + 8) = fVar41;
                    *(float *)((long)*pafVar12 + lVar37 + 4) =
                         fVar41 * (pFVar34->filter).Frequency + fVar3;
                    *(float *)((long)*pafVar12 + lVar37 + 0xc) = fVar40 + fVar41;
                    pfVar17[uVar24] = *(float *)((long)*pafVar12 + lVar37 + (ulong)FVar5 * 4);
                    lVar37 = lVar37 + 0x10;
                    uVar24 = (ulong)((int)uVar24 + 1);
                  } while ((ulong)uVar4 << 4 != lVar37);
                }
                uVar14 = uVar14 + 1;
                uVar24 = (ulong)(iVar28 + (uint)uVar4);
              } while (uVar14 != uVar15);
            }
            FAudio_PlatformUnlockMutex(pFVar34->filterLock);
          }
          FAudio_PlatformLockMutex(pFVar34->effectLock);
          if ((pFVar34->effects).count != 0) {
            uVar14 = (pFVar34->field_19).src.resampleSamples;
            iVar28 = uVar14 - uVar15;
            if (uVar15 <= uVar14 && iVar28 != 0) {
              uVar14 = (uint)((pFVar34->field_19).src.format)->nChannels;
              SDL_memset(pfVar17 + uVar15 * uVar14,0,(ulong)(iVar28 * uVar14) << 2);
              local_68 = CONCAT44(local_68._4_4_,(pFVar34->field_19).src.resampleSamples);
            }
            pfVar17 = FAudio_INTERNAL_ProcessEffectChain(pFVar34,pfVar17,(uint32_t *)&local_68);
          }
          FAudio_PlatformUnlockMutex(pFVar34->effectLock);
          if ((pFVar34->sends).SendCount == 0) {
LAB_0011a137:
            FAudio_PlatformUnlockMutex(pFVar34->sendLock);
          }
          else {
            local_50 = pLVar33;
            FAudio_PlatformLockMutex(pFVar34->volumeLock);
            if ((pFVar34->sends).SendCount != 0) {
              uVar36 = (uint32_t)local_68;
              pFVar31 = (pFVar34->sends).pSends;
              uVar24 = 0;
              do {
                pFVar13 = pFVar31[uVar24].pOutputVoice;
                bVar39 = pFVar13->type != FAUDIO_VOICE_MASTER;
                pfVar23 = *(float **)((long)&pFVar13->field_19 + (ulong)bVar39 * 8);
                uVar15 = *(uint *)((long)&pFVar13->field_19 + (ulong)bVar39 * 0x10 + 0x10);
                local_40 = (ulong)uVar15;
                (*pFVar34->sendMix[uVar24])
                          (uVar36,pFVar34->outputChannels,uVar15,pfVar17,pfVar23,
                           pFVar34->mixCoefficients[uVar24]);
                pFVar31 = (pFVar34->sends).pSends;
                if (((pFVar31[uVar24].Flags & 0x80) != 0) && (uVar36 != 0)) {
                  pFVar26 = pFVar34->sendFilter + uVar24;
                  pafVar12 = pFVar34->sendFilterState[uVar24];
                  uVar20 = 0;
                  uVar35 = 0;
                  do {
                    iVar28 = (int)uVar20;
                    if ((ushort)local_40 != 0) {
                      FVar5 = pFVar26->Type;
                      lVar37 = 0;
                      do {
                        fVar3 = *(float *)((long)*pafVar12 + lVar37 + 4);
                        fVar40 = pFVar26->Frequency * fVar3 + *(float *)((long)*pafVar12 + lVar37);
                        *(float *)((long)*pafVar12 + lVar37) = fVar40;
                        fVar41 = (pfVar23[uVar20] - fVar40) - pFVar26->OneOverQ * fVar3;
                        *(float *)((long)*pafVar12 + lVar37 + 8) = fVar41;
                        *(float *)((long)*pafVar12 + lVar37 + 4) =
                             fVar41 * pFVar26->Frequency + fVar3;
                        *(float *)((long)*pafVar12 + lVar37 + 0xc) = fVar40 + fVar41;
                        pfVar23[uVar20] = *(float *)((long)*pafVar12 + lVar37 + (ulong)FVar5 * 4);
                        lVar37 = lVar37 + 0x10;
                        uVar20 = (ulong)((int)uVar20 + 1);
                      } while ((local_40 & 0xffff) << 4 != lVar37);
                    }
                    uVar35 = uVar35 + 1;
                    uVar20 = (ulong)(iVar28 + (uint)(ushort)local_40);
                  } while (uVar35 != uVar36);
                }
                uVar24 = uVar24 + 1;
                local_58 = pFVar31;
              } while (uVar24 < (pFVar34->sends).SendCount);
            }
            FAudio_PlatformUnlockMutex(pFVar34->volumeLock);
            FAudio_PlatformUnlockMutex(pFVar34->sendLock);
            pLVar33 = local_50;
          }
        }
        else {
          pFVar31 = (FAudioSendDescriptor *)
                    ((pFVar34->field_19).src.curBufferOffsetDec + 0xffffffff +
                     (ulong)(pFVar34->field_19).src.resampleSamples *
                     (pFVar34->field_19).src.resampleStep >> 0x20);
          pFVar7 = (pFVar34->field_19).src.callback;
          if ((pFVar7 != (FAudioVoiceCallback *)0x0) &&
             (pFVar7->OnVoiceProcessingPassStart != (OnVoiceProcessingPassStartFunc)0x0)) {
            FAudio_PlatformUnlockMutex(pFVar34->sendLock);
            FAudio_PlatformUnlockMutex(pFVar34->audio->sourceLock);
            pFVar25 = (pFVar34->field_19).src.bufferList;
            pFVar19 = pFVar31;
            pFVar18 = pFVar31;
            if (pFVar31 != (FAudioSendDescriptor *)0x0 && pFVar25 != (FAudioBufferEntry *)0x0) {
              while( true ) {
                uVar36 = (pFVar25->buffer).LoopCount;
                if (uVar36 == 0) {
                  uVar15 = ((pFVar25->buffer).PlayLength + (pFVar25->buffer).PlayBegin) -
                           (pFVar34->field_19).src.curBufferOffset;
                }
                else {
                  uVar35 = (pFVar25->buffer).LoopLength;
                  uVar15 = ~(pFVar34->field_19).src.curBufferOffset +
                           uVar35 + (pFVar25->buffer).LoopBegin + uVar36 * uVar35 +
                           (pFVar25->buffer).PlayLength;
                }
                uVar14 = (uint)pFVar18 - uVar15;
                pFVar19 = (FAudioSendDescriptor *)(ulong)uVar14;
                if ((uint)pFVar18 < uVar15) break;
                pFVar25 = pFVar25->next;
                if ((pFVar25 == (FAudioBufferEntry *)0x0) || (pFVar18 = pFVar19, uVar14 == 0))
                goto LAB_0011981c;
              }
              pFVar19 = (FAudioSendDescriptor *)0x0;
            }
LAB_0011981c:
            iVar28 = (int)pFVar19;
            pFVar7 = (pFVar34->field_19).src.callback;
            pFVar16 = (pFVar34->field_19).src.format;
            if (pFVar16->wFormatTag == 2) {
              iVar28 = ((int)((ulong)pFVar19 / (ulong)pFVar16[1].wFormatTag) + 1) -
                       (uint)((int)((ulong)pFVar19 % (ulong)pFVar16[1].wFormatTag) == 0);
            }
            (*pFVar7->OnVoiceProcessingPassStart)(pFVar7,(uint)pFVar16->nBlockAlign * iVar28);
            FAudio_PlatformLockMutex(pFVar34->audio->sourceLock);
            FAudio_PlatformLockMutex(pFVar34->sendLock);
          }
          FAudio_PlatformLockMutex((pFVar34->field_19).src.bufferLock);
          pFVar25 = (pFVar34->field_19).src.bufferList;
          if (pFVar25 != (FAudioBufferEntry *)0x0) {
            local_50 = pLVar33;
            if (pFVar31 == (FAudioSendDescriptor *)0x0) {
              uVar24 = 0;
              uVar15 = 0;
LAB_00119b4f:
              uVar20 = (ulong)((pFVar25->buffer).LoopCount != 0);
              uVar14 = ((&(pFVar25->buffer).PlayLength)[uVar20 * 2] +
                       (&(pFVar25->buffer).PlayBegin)[uVar20 * 2]) -
                       (pFVar34->field_19).src.curBufferOffset;
              uVar36 = 2;
              if (uVar14 < 2) {
                uVar36 = uVar14;
              }
              (*(pFVar34->field_19).src.decode)
                        (pFVar34,&pFVar25->buffer,
                         pFVar34->audio->decodeCache +
                         ((pFVar34->field_19).src.format)->nChannels * uVar15,uVar36);
              if (uVar14 < 2) {
                uVar30 = (uint)((pFVar34->field_19).src.format)->nChannels;
                pfVar17 = pFVar34->audio->decodeCache + uVar15 * uVar30;
                iVar28 = (uVar14 * -4 + 8) * uVar30;
                goto LAB_00119c3e;
              }
            }
            else {
              uVar15 = 0;
              local_58 = pFVar31;
              do {
                if ((pFVar34->field_19).src.newBuffer != '\0') {
                  (pFVar34->field_19).src.newBuffer = '\0';
                  pFVar7 = (pFVar34->field_19).src.callback;
                  if ((pFVar7 != (FAudioVoiceCallback *)0x0) &&
                     (pFVar7->OnBufferStart != (OnBufferStartFunc)0x0)) {
                    FAudio_PlatformUnlockMutex(pFVar34->audio->sourceLock);
                    pFVar7 = (pFVar34->field_19).src.callback;
                    (*pFVar7->OnBufferStart)(pFVar7,(pFVar25->buffer).pContext);
                    FAudio_PlatformLockMutex(pFVar34->audio->sourceLock);
                  }
                }
                uVar38 = (int)pFVar31 - uVar15;
                uVar24 = (ulong)((pFVar25->buffer).LoopCount != 0);
                uVar30 = ((&(pFVar25->buffer).PlayLength)[uVar24 * 2] +
                         (&(pFVar25->buffer).PlayBegin)[uVar24 * 2]) -
                         (pFVar34->field_19).src.curBufferOffset;
                uVar14 = uVar38;
                if (uVar30 < uVar38) {
                  uVar14 = uVar30;
                }
                (*(pFVar34->field_19).src.decode)
                          (pFVar34,&pFVar25->buffer,
                           pFVar34->audio->decodeCache +
                           ((pFVar34->field_19).src.format)->nChannels * uVar15,uVar14);
                pFVar31 = local_58;
                puVar1 = &(pFVar34->field_19).src.curBufferOffset;
                *puVar1 = *puVar1 + uVar14;
                puVar2 = &(pFVar34->field_19).src.totalSamples;
                *puVar2 = *puVar2 + (ulong)uVar14;
                uVar15 = uVar15 + uVar14;
                uVar24 = (ulong)uVar15;
                if (uVar30 < uVar38) {
                  if ((pFVar25->buffer).LoopCount == 0) {
                    if (((pFVar25->buffer).Flags & 0x40) != 0) {
                      (pFVar34->field_19).src.curBufferOffsetDec = 0;
                      (pFVar34->field_19).src.totalSamples = 0;
                    }
                    pFVar8 = (pFVar34->field_19).src.bufferList;
                    pFVar25 = pFVar8->next;
                    (pFVar34->field_19).src.bufferList = pFVar25;
                    if (pFVar25 == (FAudioBufferEntry *)0x0) {
                      uVar4 = ((pFVar34->field_19).src.format)->nChannels;
                      SDL_memset(pFVar34->audio->decodeCache + uVar15 * uVar4,0,
                                 ((long)local_58 - uVar24) * (ulong)uVar4 * 4);
                    }
                    else {
                      (pFVar34->field_19).src.curBufferOffset = (pFVar25->buffer).PlayBegin;
                    }
                    if ((pFVar34->field_19).src.callback != (FAudioVoiceCallback *)0x0) {
                      FAudio_PlatformUnlockMutex(pFVar34->audio->sourceLock);
                      pFVar7 = (pFVar34->field_19).src.callback;
                      p_Var9 = pFVar7->OnBufferEnd;
                      if (p_Var9 != (OnBufferEndFunc)0x0) {
                        (*p_Var9)(pFVar7,(pFVar8->buffer).pContext);
                      }
                      if (((pFVar8->buffer).Flags & 0x40) != 0) {
                        pFVar7 = (pFVar34->field_19).src.callback;
                        p_Var10 = pFVar7->OnStreamEnd;
                        if (p_Var10 != (OnStreamEndFunc)0x0) {
                          (*p_Var10)(pFVar7);
                        }
                      }
                      if (pFVar25 == (FAudioBufferEntry *)0x0) {
                        pFVar25 = (pFVar34->field_19).src.bufferList;
                        if (pFVar25 != (FAudioBufferEntry *)0x0) {
                          (pFVar34->field_19).src.curBufferOffset = (pFVar25->buffer).PlayBegin;
                          goto LAB_00119b00;
                        }
                        pFVar25 = (FAudioBufferEntry *)0x0;
                      }
                      else {
LAB_00119b00:
                        pFVar7 = (pFVar34->field_19).src.callback;
                        p_Var11 = pFVar7->OnBufferStart;
                        if (p_Var11 != (OnBufferStartFunc)0x0) {
                          (*p_Var11)(pFVar7,(pFVar25->buffer).pContext);
                        }
                      }
                      FAudio_PlatformLockMutex(pFVar34->audio->sourceLock);
                    }
                    (*pFVar34->audio->pFree)(pFVar8);
                  }
                  else {
                    (pFVar34->field_19).src.curBufferOffset = (pFVar25->buffer).LoopBegin;
                    uVar14 = (pFVar25->buffer).LoopCount;
                    if (uVar14 < 0xff) {
                      (pFVar25->buffer).LoopCount = uVar14 - 1;
                    }
                    pFVar7 = (pFVar34->field_19).src.callback;
                    if ((pFVar7 != (FAudioVoiceCallback *)0x0) &&
                       (pFVar7->OnLoopEnd != (OnLoopEndFunc)0x0)) {
                      FAudio_PlatformUnlockMutex(pFVar34->audio->sourceLock);
                      pFVar7 = (pFVar34->field_19).src.callback;
                      (*pFVar7->OnLoopEnd)(pFVar7,(pFVar25->buffer).pContext);
                      FAudio_PlatformLockMutex(pFVar34->audio->sourceLock);
                    }
                  }
                }
              } while ((uVar15 < (uint)pFVar31) && (pFVar25 != (FAudioBufferEntry *)0x0));
              if (pFVar25 != (FAudioBufferEntry *)0x0) goto LAB_00119b4f;
              uVar14 = (uint)((pFVar34->field_19).src.format)->nChannels;
              pfVar17 = pFVar34->audio->decodeCache + uVar15 * uVar14;
              iVar28 = uVar14 << 3;
LAB_00119c3e:
              SDL_memset(pfVar17,0,iVar28);
            }
            pLVar33 = local_50;
            if (((pFVar34->field_19).src.curBufferOffsetDec != 0) &&
               (uVar27 = (pFVar34->field_19).src.totalSamples, uVar27 != 0)) {
              (pFVar34->field_19).src.totalSamples = uVar27 - 1;
            }
            pFVar7 = (pFVar34->field_19).src.callback;
            if ((pFVar7 != (FAudioVoiceCallback *)0x0) &&
               (pFVar7->OnVoiceProcessingPassEnd != (OnVoiceProcessingPassEndFunc)0x0)) {
              FAudio_PlatformUnlockMutex((pFVar34->field_19).src.bufferLock);
              FAudio_PlatformUnlockMutex(pFVar34->sendLock);
              FAudio_PlatformUnlockMutex(pFVar34->audio->sourceLock);
              pFVar7 = (pFVar34->field_19).src.callback;
              (*pFVar7->OnVoiceProcessingPassEnd)(pFVar7);
              FAudio_PlatformLockMutex(pFVar34->audio->sourceLock);
              FAudio_PlatformLockMutex(pFVar34->sendLock);
              FAudio_PlatformLockMutex((pFVar34->field_19).src.bufferLock);
            }
            if (uVar24 != 0) {
              uVar20 = (pFVar34->field_19).src.resampleStep;
              uVar24 = ((uVar24 << 0x20 | 0xffffffff) - (pFVar34->field_19).src.curBufferOffsetDec)
                       / uVar20 + 2;
              uVar15 = (pFVar34->field_19).src.resampleSamples;
              if (uVar15 <= uVar24) {
                uVar24 = (ulong)uVar15;
              }
              pFVar32 = pFVar34->audio;
              if (uVar20 == 0x100000000) {
                ppfVar21 = &pFVar32->decodeCache;
              }
              else {
                uVar4 = ((pFVar34->field_19).src.format)->nChannels;
                uVar15 = uVar15 * uVar4;
                if (pFVar32->resampleSamples < uVar15) {
                  pFVar32->resampleSamples = uVar15;
                  pfVar17 = (float *)(*pFVar32->pRealloc)(pFVar32->resampleCache,(ulong)uVar15 << 2)
                  ;
                  pFVar32->resampleCache = pfVar17;
                  pFVar32 = pFVar34->audio;
                  uVar20 = (pFVar34->field_19).src.resampleStep;
                  uVar4 = ((pFVar34->field_19).src.format)->nChannels;
                }
                (*(pFVar34->field_19).src.resample)
                          (pFVar32->decodeCache,pFVar32->resampleCache,
                           &(pFVar34->field_19).src.resampleOffset,uVar20,uVar24,(uint8_t)uVar4);
                ppfVar21 = &pFVar34->audio->resampleCache;
              }
              pfVar17 = *ppfVar21;
              if ((pFVar34->field_19).src.bufferList == (FAudioBufferEntry *)0x0) {
                (pFVar34->field_19).src.curBufferOffsetDec = 0;
                (pFVar34->field_19).src.curBufferOffset = 0;
              }
              else {
                uVar15 = (pFVar34->field_19).master.inputChannels * (int)uVar24 +
                         (pFVar34->field_19).mix.inputChannels;
                *(ulong *)((long)&pFVar34->field_19 + 0x20) = (ulong)uVar15;
                if ((uVar15 != 0) && (uVar36 = (pFVar34->field_19).src.curBufferOffset, uVar36 != 0)
                   ) {
                  (pFVar34->field_19).src.curBufferOffset = uVar36 - 1;
                }
              }
              FAudio_PlatformUnlockMutex((pFVar34->field_19).src.bufferLock);
              local_68 = CONCAT44(local_68._4_4_,(int)uVar24);
              goto LAB_00119e42;
            }
            FAudio_PlatformUnlockMutex((pFVar34->field_19).src.bufferLock);
            goto LAB_0011a137;
          }
          FAudio_PlatformUnlockMutex((pFVar34->field_19).src.bufferLock);
          if (((pFVar34->effects).count != 0) && ((pFVar34->effects).state != FAPO_BUFFER_SILENT)) {
            pFVar32 = pFVar34->audio;
            uVar15 = (pFVar34->field_19).src.resampleSamples;
            pFVar16 = (pFVar34->field_19).src.format;
            goto LAB_001196e6;
          }
          FAudio_PlatformUnlockMutex(pFVar34->sendLock);
          FAudio_PlatformUnlockMutex(pFVar34->audio->sourceLock);
          pFVar7 = (pFVar34->field_19).src.callback;
          if ((pFVar7 != (FAudioVoiceCallback *)0x0) &&
             (pFVar7->OnVoiceProcessingPassEnd != (OnVoiceProcessingPassEndFunc)0x0)) {
            (*pFVar7->OnVoiceProcessingPassEnd)(pFVar7);
          }
          FAudio_PlatformLockMutex(pFVar34->audio->sourceLock);
        }
        audio = local_60;
        FAudio_INTERNAL_FlushPendingBuffers(local_60->processingSource);
      }
    }
    audio->processingSource = (FAudioSourceVoice *)0x0;
    FAudio_PlatformUnlockMutex(audio->sourceLock);
    FAudio_PlatformLockMutex(audio->submixLock);
    for (pLVar33 = audio->submixes; pLVar33 != (LinkedList *)0x0; pLVar33 = pLVar33->next) {
      pFVar34 = (FAudioVoice *)pLVar33->entry;
      local_68 = 0;
      FAudio_PlatformLockMutex(pFVar34->sendLock);
      uVar27 = (pFVar34->field_19).src.resampleStep;
      if (uVar27 == 0x100000000) {
        ppfVar21 = &(pFVar34->field_19).mix.inputCache;
      }
      else {
        pFVar32 = pFVar34->audio;
        uVar36 = (pFVar34->field_19).src.resampleSamples;
        uVar35 = (pFVar34->field_19).mix.inputChannels;
        uVar15 = uVar35 * uVar36;
        if (pFVar32->resampleSamples < uVar15) {
          pFVar32->resampleSamples = uVar15;
          pfVar17 = (float *)(*pFVar32->pRealloc)(pFVar32->resampleCache,(ulong)uVar15 << 2);
          pFVar32->resampleCache = pfVar17;
          pFVar32 = pFVar34->audio;
          uVar27 = (pFVar34->field_19).src.resampleStep;
          uVar36 = (pFVar34->field_19).src.resampleSamples;
          uVar35 = (pFVar34->field_19).mix.inputChannels;
        }
        (*(pFVar34->field_19).mix.resample)
                  ((pFVar34->field_19).mix.inputCache,pFVar32->resampleCache,&local_68,uVar27,
                   (ulong)uVar36,(uint8_t)uVar35);
        ppfVar21 = &pFVar34->audio->resampleCache;
      }
      pfVar17 = *ppfVar21;
      uVar36 = (pFVar34->field_19).mix.inputChannels;
      uVar35 = (pFVar34->field_19).src.resampleSamples * uVar36;
      fVar3 = pFVar34->volume;
      if ((fVar3 != 1.0) || (NAN(fVar3))) {
        (*FAudio_INTERNAL_Amplify)(pfVar17,uVar35,fVar3);
        uVar36 = (pFVar34->field_19).mix.inputChannels;
      }
      uVar15 = uVar35 / uVar36;
      local_44 = uVar15;
      if ((pFVar34->flags & 8) != 0) {
        FAudio_PlatformLockMutex(pFVar34->filterLock);
        if (uVar36 <= uVar35) {
          pafVar12 = pFVar34->filterState;
          uVar4 = *(ushort *)((long)&pFVar34->field_19 + 0x20);
          uVar24 = 0;
          uVar14 = 0;
          do {
            iVar28 = (int)uVar24;
            if (uVar4 != 0) {
              FVar5 = (pFVar34->filter).Type;
              lVar37 = 0;
              do {
                fVar3 = *(float *)((long)*pafVar12 + lVar37 + 4);
                fVar40 = (pFVar34->filter).Frequency * fVar3 + *(float *)((long)*pafVar12 + lVar37);
                *(float *)((long)*pafVar12 + lVar37) = fVar40;
                fVar41 = (pfVar17[uVar24] - fVar40) - (pFVar34->filter).OneOverQ * fVar3;
                *(float *)((long)*pafVar12 + lVar37 + 8) = fVar41;
                *(float *)((long)*pafVar12 + lVar37 + 4) =
                     fVar41 * (pFVar34->filter).Frequency + fVar3;
                *(float *)((long)*pafVar12 + lVar37 + 0xc) = fVar40 + fVar41;
                pfVar17[uVar24] = *(float *)((long)*pafVar12 + lVar37 + (ulong)FVar5 * 4);
                lVar37 = lVar37 + 0x10;
                uVar24 = (ulong)((int)uVar24 + 1);
              } while ((ulong)uVar4 << 4 != lVar37);
            }
            uVar14 = uVar14 + 1;
            uVar24 = (ulong)(iVar28 + (uint)uVar4);
          } while (uVar14 != uVar15);
        }
        FAudio_PlatformUnlockMutex(pFVar34->filterLock);
      }
      FAudio_PlatformLockMutex(pFVar34->effectLock);
      if ((pFVar34->effects).count != 0) {
        pfVar17 = FAudio_INTERNAL_ProcessEffectChain(pFVar34,pfVar17,&local_44);
      }
      FAudio_PlatformUnlockMutex(pFVar34->effectLock);
      if ((pFVar34->sends).SendCount != 0) {
        local_50 = pLVar33;
        FAudio_PlatformLockMutex(pFVar34->volumeLock);
        uVar15 = local_44;
        if ((pFVar34->sends).SendCount != 0) {
          pFVar31 = (pFVar34->sends).pSends;
          uVar24 = 0;
          do {
            pFVar13 = pFVar31[uVar24].pOutputVoice;
            bVar39 = pFVar13->type != FAUDIO_VOICE_MASTER;
            pfVar23 = *(float **)((long)&pFVar13->field_19 + (ulong)bVar39 * 8);
            uVar14 = *(uint *)((long)&pFVar13->field_19 + (ulong)bVar39 * 0x10 + 0x10);
            local_40 = (ulong)uVar14;
            (*pFVar34->sendMix[uVar24])
                      (uVar15,pFVar34->outputChannels,uVar14,pfVar17,pfVar23,
                       pFVar34->mixCoefficients[uVar24]);
            pFVar31 = (pFVar34->sends).pSends;
            if (((pFVar31[uVar24].Flags & 0x80) != 0) && (uVar15 != 0)) {
              pFVar26 = pFVar34->sendFilter + uVar24;
              pafVar12 = pFVar34->sendFilterState[uVar24];
              uVar20 = 0;
              uVar36 = 0;
              do {
                iVar28 = (int)uVar20;
                if ((ushort)local_40 != 0) {
                  FVar5 = pFVar26->Type;
                  lVar37 = 0;
                  do {
                    fVar3 = *(float *)((long)*pafVar12 + lVar37 + 4);
                    fVar40 = pFVar26->Frequency * fVar3 + *(float *)((long)*pafVar12 + lVar37);
                    *(float *)((long)*pafVar12 + lVar37) = fVar40;
                    fVar41 = (pfVar23[uVar20] - fVar40) - pFVar26->OneOverQ * fVar3;
                    *(float *)((long)*pafVar12 + lVar37 + 8) = fVar41;
                    *(float *)((long)*pafVar12 + lVar37 + 4) = fVar41 * pFVar26->Frequency + fVar3;
                    *(float *)((long)*pafVar12 + lVar37 + 0xc) = fVar40 + fVar41;
                    pfVar23[uVar20] = *(float *)((long)*pafVar12 + lVar37 + (ulong)FVar5 * 4);
                    lVar37 = lVar37 + 0x10;
                    uVar20 = (ulong)((int)uVar20 + 1);
                  } while ((local_40 & 0xffff) << 4 != lVar37);
                }
                uVar36 = uVar36 + 1;
                uVar20 = (ulong)(iVar28 + (uint)(ushort)local_40);
              } while (uVar36 != uVar15);
            }
            uVar24 = uVar24 + 1;
            local_58 = pFVar31;
          } while (uVar24 < (pFVar34->sends).SendCount);
        }
        FAudio_PlatformUnlockMutex(pFVar34->volumeLock);
        pLVar33 = local_50;
      }
      FAudio_PlatformUnlockMutex(pFVar34->sendLock);
      SDL_memset((pFVar34->field_19).mix.inputCache,0,
                 (ulong)(pFVar34->field_19).src.decodeSamples << 2);
      audio = local_60;
    }
    FAudio_PlatformUnlockMutex(audio->submixLock);
    pFVar22 = audio->master;
    fVar3 = pFVar22->volume;
    if ((fVar3 != 1.0) || (NAN(fVar3))) {
      (*FAudio_INTERNAL_Amplify)
                ((pFVar22->field_19).master.output,
                 (pFVar22->field_19).master.inputChannels * audio->updateSize,fVar3);
      pFVar22 = audio->master;
    }
    pfVar17 = local_38;
    FAudio_PlatformLockMutex(pFVar22->effectLock);
    pFVar34 = audio->master;
    if ((pFVar34->effects).count != 0) {
      local_68 = CONCAT44(local_68._4_4_,audio->updateSize);
      pfVar23 = FAudio_INTERNAL_ProcessEffectChain
                          (pFVar34,(pFVar34->field_19).master.output,(uint32_t *)&local_68);
      audio = local_60;
      uVar15 = (uint32_t)local_68;
      if (pfVar23 != pfVar17) {
        SDL_memcpy(pfVar17,pfVar23,
                   (ulong)(local_60->master->outputChannels * (uint32_t)local_68) << 2);
      }
      pFVar34 = audio->master;
      uVar14 = audio->updateSize - uVar15;
      if (uVar15 <= audio->updateSize && uVar14 != 0) {
        SDL_memset(pfVar17 + uVar15 * pFVar34->outputChannels,0,(ulong)uVar14 << 2);
        pFVar34 = audio->master;
      }
    }
    FAudio_PlatformUnlockMutex(pFVar34->effectLock);
    FAudio_PlatformLockMutex(audio->callbackLock);
    for (pLVar33 = audio->callbacks; pLVar33 != (LinkedList *)0x0; pLVar33 = pLVar33->next) {
      pcVar6 = *(code **)((long)pLVar33->entry + 8);
      if (pcVar6 != (code *)0x0) {
        (*pcVar6)();
      }
    }
    FAudio_PlatformUnlockMutex(audio->callbackLock);
  }
  return;
}

Assistant:

static void FAUDIOCALL FAudio_INTERNAL_GenerateOutput(FAudio *audio, float *output)
{
	uint32_t totalSamples;
	LinkedList *list;
	float *effectOut;
	FAudioEngineCallback *callback;

	LOG_FUNC_ENTER(audio)
	if (!audio->active)
	{
		LOG_FUNC_EXIT(audio)
		return;
	}

	/* Apply any committed changes */
	FAudio_OPERATIONSET_Execute(audio);

	/* ProcessingPassStart callbacks */
	FAudio_PlatformLockMutex(audio->callbackLock);
	LOG_MUTEX_LOCK(audio, audio->callbackLock)
	list = audio->callbacks;
	while (list != NULL)
	{
		callback = (FAudioEngineCallback*) list->entry;
		if (callback->OnProcessingPassStart != NULL)
		{
			callback->OnProcessingPassStart(
				callback
			);
		}
		list = list->next;
	}
	FAudio_PlatformUnlockMutex(audio->callbackLock);
	LOG_MUTEX_UNLOCK(audio, audio->callbackLock)

	/* Writes to master will directly write to output, but ONLY if there
	 * isn't any channel-changing effect processing to do first.
	 */
	if (audio->master->master.effectCache != NULL)
	{
		audio->master->master.output = audio->master->master.effectCache;
		FAudio_zero(
			audio->master->master.effectCache,
			(
				sizeof(float) *
				audio->updateSize *
				audio->master->master.inputChannels
			)
		);
	}
	else
	{
		audio->master->master.output = output;
	}

	/* Mix sources */
	FAudio_PlatformLockMutex(audio->sourceLock);
	LOG_MUTEX_LOCK(audio, audio->sourceLock)
	list = audio->sources;
	while (list != NULL)
	{
		audio->processingSource = (FAudioSourceVoice*) list->entry;

		FAudio_INTERNAL_FlushPendingBuffers(audio->processingSource);
		if (audio->processingSource->src.active)
		{
			FAudio_INTERNAL_MixSource(audio->processingSource);
			FAudio_INTERNAL_FlushPendingBuffers(audio->processingSource);
		}

		list = list->next;
	}
	audio->processingSource = NULL;
	FAudio_PlatformUnlockMutex(audio->sourceLock);
	LOG_MUTEX_UNLOCK(audio, audio->sourceLock)

	/* Mix submixes, ordered by processing stage */
	FAudio_PlatformLockMutex(audio->submixLock);
	LOG_MUTEX_LOCK(audio, audio->submixLock)
	list = audio->submixes;
	while (list != NULL)
	{
		FAudio_INTERNAL_MixSubmix((FAudioSubmixVoice*) list->entry);
		list = list->next;
	}
	FAudio_PlatformUnlockMutex(audio->submixLock);
	LOG_MUTEX_UNLOCK(audio, audio->submixLock)

	/* Apply master volume */
	if (audio->master->volume != 1.0f)
	{
		FAudio_INTERNAL_Amplify(
			audio->master->master.output,
			audio->updateSize * audio->master->master.inputChannels,
			audio->master->volume
		);
	}

	/* Process master effect chain */
	FAudio_PlatformLockMutex(audio->master->effectLock);
	LOG_MUTEX_LOCK(audio, audio->master->effectLock)
	if (audio->master->effects.count > 0)
	{
		totalSamples = audio->updateSize;
		effectOut = FAudio_INTERNAL_ProcessEffectChain(
			audio->master,
			audio->master->master.output,
			&totalSamples
		);

		if (effectOut != output)
		{
			FAudio_memcpy(
				output,
				effectOut,
				totalSamples * audio->master->outputChannels * sizeof(float)
			);
		}
		if (totalSamples < audio->updateSize)
		{
			FAudio_zero(
				output + (totalSamples * audio->master->outputChannels),
				(audio->updateSize - totalSamples) * sizeof(float)
			);
		}
	}
	FAudio_PlatformUnlockMutex(audio->master->effectLock);
	LOG_MUTEX_UNLOCK(audio, audio->master->effectLock)

	/* OnProcessingPassEnd callbacks */
	FAudio_PlatformLockMutex(audio->callbackLock);
	LOG_MUTEX_LOCK(audio, audio->callbackLock)
	list = audio->callbacks;
	while (list != NULL)
	{
		callback = (FAudioEngineCallback*) list->entry;
		if (callback->OnProcessingPassEnd != NULL)
		{
			callback->OnProcessingPassEnd(
				callback
			);
		}
		list = list->next;
	}
	FAudio_PlatformUnlockMutex(audio->callbackLock);
	LOG_MUTEX_UNLOCK(audio, audio->callbackLock)

	LOG_FUNC_EXIT(audio)
}